

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O2

void on_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *rdbuf)

{
  int iVar1;
  uv_write_t *req;
  char *pcVar2;
  undefined8 uStack_20;
  uv_buf_t local_18;
  
  if (nread == -0xfff || 0 < nread) {
    if ((nread < 1) || (output_used = (int)nread + output_used, output_used != 0xc)) {
LAB_0014eb06:
      on_read_cb_called = on_read_cb_called + 1;
      return;
    }
    iVar1 = bcmp("hello world\n",output,0xc);
    if (iVar1 == 0) {
      local_18 = uv_buf_init(output,0xc);
      req = (uv_write_t *)malloc(0xc0);
      iVar1 = uv_write(req,(uv_stream_t *)&in,&local_18,1,after_write);
      if (iVar1 == 0) goto LAB_0014eb06;
      pcVar2 = "r == 0";
      uStack_20 = 0x6f;
    }
    else {
      pcVar2 = "memcmp(\"hello world\\n\", output, 12) == 0";
      uStack_20 = 0x6b;
    }
  }
  else {
    pcVar2 = "nread > 0 || nread == UV_EOF";
    uStack_20 = 0x66;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

static void on_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* rdbuf) {
  uv_write_t* req;
  uv_buf_t wrbuf;
  int r;

  ASSERT(nread > 0 || nread == UV_EOF);

  if (nread > 0) {
    output_used += nread;
    if (output_used == 12) {
      ASSERT(memcmp("hello world\n", output, 12) == 0);
      wrbuf = uv_buf_init(output, output_used);
      req = malloc(sizeof(*req));
      r = uv_write(req, (uv_stream_t*)&in, &wrbuf, 1, after_write);
      ASSERT(r == 0);
    }
  }

  on_read_cb_called++;
}